

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O2

void __thiscall remote::Module::CacheSymbolData64(Module *this,void *buffer)

{
  Elf64_Word EVar1;
  ostream *poVar2;
  size_t sVar3;
  Elf64_Phdr *pEVar4;
  Elf64_Shdr *pEVar5;
  char *pcVar6;
  size_t i;
  size_t sVar7;
  string attrString;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"CacheSymbolData64");
  std::endl<char,std::char_traits<char>>(poVar2);
  sVar3 = elf::arch64::GetProgramHeaderEntryCount(buffer);
  for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
    pEVar4 = elf::arch64::GetProgramHeaderEntry(buffer,sVar7);
    if (pEVar4 != (Elf64_Phdr *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Prog: ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      EVar1 = pEVar4->p_type;
      pcVar6 = "[PT_NULL]";
      switch(EVar1) {
      case 0:
        break;
      case 1:
        pcVar6 = "[PT_LOAD]";
        break;
      case 2:
        pcVar6 = "[PT_DYNAMIC]";
        break;
      case 3:
        pcVar6 = "[PT_INTERP]";
        break;
      case 4:
        pcVar6 = "[PT_NOTE]";
        break;
      case 5:
        pcVar6 = "[PT_SHLIB]";
        break;
      case 6:
        pcVar6 = "[PT_PHDR]";
        break;
      case 7:
        pcVar6 = "[PT_TLS]";
        break;
      default:
        if (EVar1 == 0x60000000) {
          pcVar6 = "[PT_LOOS]";
        }
        else if (EVar1 == 0x6474e550) {
          pcVar6 = "[PT_GNU_EH_FRAME]";
        }
        else if (EVar1 == 0x6474e551) {
          pcVar6 = "[PT_GNU_STACK]";
        }
        else if (EVar1 == 0x6474e552) {
          pcVar6 = "[PT_GNU_RELRO]";
        }
        else if (EVar1 == 0x6fffffff) {
          pcVar6 = "[PT_HIOS]";
        }
        else if (EVar1 == 0x70000000) {
          pcVar6 = "[PT_LOPROC]";
        }
        else if (EVar1 == 0x7fffffff) {
          pcVar6 = "[PT_HIPROC]";
        }
        else {
          pcVar6 = "[Default]";
        }
      }
      poVar2 = std::operator<<((ostream *)&std::cout,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar2);
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  sVar3 = elf::arch64::GetSectionHeaderEntryCount(buffer);
  poVar2 = std::operator<<((ostream *)&std::cout,"Section Count: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  sVar7 = 0;
  do {
    if (sVar3 == sVar7) {
      return;
    }
    pEVar5 = elf::arch64::GetSectionHeaderEntry(buffer,sVar7);
    if (pEVar5 != (Elf64_Shdr *)0x0) {
      EVar1 = pEVar5->sh_type;
      pcVar6 = " - SYMTAB (";
      if (EVar1 != 2) {
        if (EVar1 == 9) {
          pcVar6 = " - REL (";
        }
        else {
          if (EVar1 != 3) goto LAB_00106217;
          pcVar6 = " - STRTAB (";
        }
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Section [");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,"]: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," - ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,pcVar6);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,")");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
LAB_00106217:
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

void remote::Module::CacheSymbolData64(void* buffer) {
    std::cout << "CacheSymbolData64" << std::endl;

    size_t programCount = elf::arch64::GetProgramHeaderEntryCount(buffer);

    for(size_t i = 0; i < programCount; ++i) {
        Elf64_Phdr *prog = elf::arch64::GetProgramHeaderEntry(buffer, i);

        if (!prog)
            continue;

        std::cout << "Prog: " << std::hex << prog->p_offset << ":" << prog->p_paddr << ":" << prog->p_vaddr << ":" << prog->p_type << ":" << prog->p_flags << std::endl;

        switch (prog->p_type) {
            case PT_NULL:
                std::cout << "[PT_NULL]" << std::endl;
                break;
            case PT_LOAD:
                std::cout << "[PT_LOAD]" << std::endl;
                break;
            case PT_DYNAMIC:
                std::cout << "[PT_DYNAMIC]" << std::endl;
                break;
            case PT_INTERP:
                std::cout << "[PT_INTERP]" << std::endl;
                break;
            case PT_NOTE:
                std::cout << "[PT_NOTE]" << std::endl;
                break;
            case PT_SHLIB:
                std::cout << "[PT_SHLIB]" << std::endl;
                break;
            case PT_PHDR:
                std::cout << "[PT_PHDR]" << std::endl;
                break;
            case PT_TLS:
                std::cout << "[PT_TLS]" << std::endl;
                break;
            case PT_LOOS:
                std::cout << "[PT_LOOS]" << std::endl;
                break;
            case PT_HIOS:
                std::cout << "[PT_HIOS]" << std::endl;
                break;
            case PT_LOPROC:
                std::cout << "[PT_LOPROC]" << std::endl;
                break;
            case PT_HIPROC:
                std::cout << "[PT_HIPROC]" << std::endl;
                break;
            case PT_GNU_EH_FRAME:
                std::cout << "[PT_GNU_EH_FRAME]" << std::endl;
                break;
            case PT_GNU_STACK:
                std::cout << "[PT_GNU_STACK]" << std::endl;
                break;
            case PT_GNU_RELRO:
                std::cout << "[PT_GNU_RELRO]" << std::endl;
                break;
            default:
                std::cout << "[Default]" << std::endl;
                break;
        }

        std::string attrString;

        attrString.append((prog->p_flags & PF_R) ? "r" : "-");
        attrString.append((prog->p_flags & PF_W) ? "w" : "-");
        attrString.append((prog->p_flags & PF_X) ? "x" : "-");

        std::cout << attrString << std::endl;
    }

    size_t sectionCount = elf::arch64::GetSectionHeaderEntryCount(buffer);

    std::cout << "Section Count: " << sectionCount << std::endl;

    for(size_t i = 0; i < sectionCount; i++) {
        Elf64_Shdr* sec = elf::arch64::GetSectionHeaderEntry(buffer, i);

        if(!sec)
            continue;

        switch(sec->sh_type) {
            case SHT_SYMTAB:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - SYMTAB (" << sec->sh_type << ")" << std::endl;
                break;
            case SHT_STRTAB:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - STRTAB (" << sec->sh_type << ")" << std::endl;
                break;
            case SHT_REL:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - REL (" << sec->sh_type << ")" << std::endl;
                break;
        }

        /*
        const char* name = elf::arch64::GetNameOfSectionAtIndex(buffer, sec);

        if(!name)
            continue;

        std::cout << "Section: " << name << std::endl;*/
    }
}